

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void vkt::api::anon_unknown_0::addImageToImageAllFormatsDepthStencilTests(TestCaseGroup *group)

{
  VkDeviceSize *pVVar1;
  size_type *psVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  VkFormat VVar6;
  pointer __src;
  pointer pCVar7;
  bool bVar8;
  TextureFormat TVar9;
  long *plVar10;
  undefined8 *puVar11;
  pointer __dest;
  ulong *puVar12;
  VkFormat extraout_EDX;
  VkFormat extraout_EDX_00;
  VkFormat extraout_EDX_01;
  VkFormat extraout_EDX_02;
  VkFormat format;
  undefined8 *extraout_RDX;
  undefined8 *puVar13;
  VkFormat VVar14;
  uint uVar15;
  ulong __n;
  undefined8 uVar16;
  int iVar17;
  ulong __n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string description;
  string testName;
  TestParams params;
  string local_1e8;
  undefined4 uStack_1c8;
  undefined8 uStack_1c4;
  string local_1b8;
  string local_198;
  undefined1 local_178 [80];
  string local_128;
  TestCaseGroup *local_108;
  long local_100;
  undefined4 local_f8;
  VkFormat VStack_f4;
  undefined8 uStack_f0;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  VkFormat VStack_dc;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
  local_c8;
  undefined4 local_b0;
  string local_a8;
  Data local_88;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  pointer local_58;
  long local_50;
  long local_48;
  undefined4 local_40;
  
  paVar4 = &local_1e8.field_2;
  local_100 = 0;
  local_108 = group;
  do {
    paVar18 = &local_1b8.field_2;
    local_c8.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f8 = 1;
    uStack_e0 = 1;
    local_e8 = 1;
    uStack_f0 = 0x4000000040;
    uStack_d0 = 1;
    local_d8 = 0x4000000040;
    VStack_f4 = (&DAT_00aaafd0)[local_100];
    uVar15 = 0xfffffff0;
    iVar17 = 0x30;
    VStack_dc = VStack_f4;
    do {
      VVar14 = VStack_f4;
      TVar9 = ::vk::mapVkFormat(VStack_f4);
      bVar8 = tcu::hasDepthComponent(TVar9.order);
      uVar15 = uVar15 + 0x10;
      if (bVar8) {
        local_1e8._M_dataplus._M_p = (pointer)0x2;
        local_1e8._M_string_length = 0x100000000;
        local_1e8.field_2._8_4_ = 0;
        local_1e8.field_2._M_allocated_capacity = 0;
        local_1e8.field_2._12_4_ = 2;
        uStack_1c8 = 0;
        uStack_1c4 = 0x100000000;
        local_178._0_8_ = (long *)0x2;
        local_178._8_8_ = 0x100000000;
        local_178._16_8_ = 0;
        local_178._24_4_ = 0;
        local_178._28_4_ = 2;
        local_178._32_4_ = 0;
        local_178._36_8_ = 0x100000000;
        local_178._52_4_ = 0;
        local_178._56_8_ = 0x1000000010;
        local_178._64_4_ = 1;
        local_178._44_4_ = uVar15;
        local_178._48_4_ = iVar17;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back(&local_c8,(value_type *)local_178);
        VVar14 = VStack_f4;
      }
      TVar9 = ::vk::mapVkFormat(VVar14);
      bVar8 = tcu::hasStencilComponent(TVar9.order);
      VVar14 = extraout_EDX;
      if (bVar8) {
        local_1e8._M_dataplus._M_p = (pointer)0x4;
        local_1e8._M_string_length = 0x100000000;
        local_1e8.field_2._8_4_ = 0;
        local_1e8.field_2._M_allocated_capacity = 0;
        local_1e8.field_2._12_4_ = 4;
        uStack_1c8 = 0;
        uStack_1c4 = 0x100000000;
        local_178._0_8_ = (long *)0x4;
        local_178._8_8_ = 0x100000000;
        local_178._16_8_ = 0;
        local_178._24_4_ = 0;
        local_178._28_4_ = 4;
        local_178._32_4_ = 0;
        local_178._36_8_ = 0x100000000;
        local_178._52_4_ = 0;
        local_178._56_8_ = 0x1000000010;
        local_178._64_4_ = 1;
        local_178._44_4_ = uVar15;
        local_178._48_4_ = iVar17;
        std::
        vector<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
        ::push_back(&local_c8,(value_type *)local_178);
        VVar14 = extraout_EDX_00;
      }
      VVar6 = VStack_f4;
      iVar17 = iVar17 + -0x10;
    } while (uVar15 < 0x30);
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_1b8,(_anonymous_namespace_ *)(ulong)VStack_f4,VVar14);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    VVar14 = VStack_dc;
    paVar5 = &local_198.field_2;
    puVar12 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1e8.field_2._M_allocated_capacity = *puVar12;
      local_1e8.field_2._8_4_ = (undefined4)plVar10[3];
      local_1e8.field_2._12_4_ = (undefined4)((ulong)plVar10[3] >> 0x20);
      local_1e8._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *puVar12;
      local_1e8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1e8._M_string_length = plVar10[1];
    *plVar10 = (long)puVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_198,(_anonymous_namespace_ *)(ulong)VStack_dc,
               (VkFormat)local_1e8._M_string_length);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar4) {
      uVar16 = local_1e8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_198._M_string_length + local_1e8._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar5) {
        uVar16 = local_198.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_198._M_string_length + local_1e8._M_string_length)
      goto LAB_0043b994;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_198,0,(char *)0x0,(ulong)local_1e8._M_dataplus._M_p);
    }
    else {
LAB_0043b994:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1e8,(ulong)local_198._M_dataplus._M_p);
    }
    local_178._0_8_ = local_178 + 0x10;
    pVVar1 = puVar11 + 2;
    if ((VkDeviceSize *)*puVar11 == pVVar1) {
      local_178._16_8_ = *pVVar1;
      local_178._24_4_ = (undefined4)puVar11[3];
      local_178._28_4_ = (undefined4)((ulong)puVar11[3] >> 0x20);
    }
    else {
      local_178._16_8_ = *pVVar1;
      local_178._0_8_ = (VkDeviceSize *)*puVar11;
    }
    puVar13 = puVar11 + 1;
    local_178._8_8_ = puVar11[1];
    *puVar11 = pVVar1;
    *puVar13 = 0;
    *(undefined1 *)pVVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar5) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      puVar13 = extraout_RDX;
    }
    format = (VkFormat)puVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      format = extraout_EDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar18) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      format = extraout_EDX_02;
    }
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_a8,(_anonymous_namespace_ *)(ulong)VVar6,format);
    plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_a8,0,(char *)0x0,0xaa9616);
    puVar12 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_198.field_2._M_allocated_capacity = *puVar12;
      local_198.field_2._8_8_ = plVar10[3];
      local_198._M_dataplus._M_p = (pointer)paVar5;
    }
    else {
      local_198.field_2._M_allocated_capacity = *puVar12;
      local_198._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_198._M_string_length = plVar10[1];
    *plVar10 = (long)puVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_198);
    puVar12 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_1b8.field_2._M_allocated_capacity = *puVar12;
      local_1b8.field_2._8_8_ = plVar10[3];
      local_1b8._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_1b8.field_2._M_allocated_capacity = *puVar12;
      local_1b8._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_1b8._M_string_length = plVar10[1];
    *plVar10 = (long)puVar12;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    api::(anonymous_namespace)::getFormatCaseName_abi_cxx11_
              (&local_128,(_anonymous_namespace_ *)(ulong)VVar14,
               (VkFormat)local_1b8._M_string_length);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar18) {
      uVar16 = local_1b8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_128._M_string_length + local_1b8._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar16 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_128._M_string_length + local_1b8._M_string_length)
      goto LAB_0043bb5f;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_128,0,(char *)0x0,(ulong)local_1b8._M_dataplus._M_p);
    }
    else {
LAB_0043bb5f:
      puVar11 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_1b8,(ulong)local_128._M_dataplus._M_p);
    }
    psVar2 = puVar11 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_1e8.field_2._M_allocated_capacity = *psVar2;
      local_1e8.field_2._8_4_ = (undefined4)puVar11[3];
      local_1e8.field_2._12_4_ = (undefined4)((ulong)puVar11[3] >> 0x20);
      local_1e8._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar2;
      local_1e8._M_dataplus._M_p = (pointer)*puVar11;
    }
    local_1e8._M_string_length = puVar11[1];
    *puVar11 = psVar2;
    puVar11[1] = 0;
    *(undefined1 *)psVar2 = 0;
    __n = local_1e8._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      __n = local_128.field_2._M_allocated_capacity + 1;
      operator_delete(local_128._M_dataplus._M_p,__n);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar18) {
      __n = local_1b8.field_2._M_allocated_capacity + 1;
      operator_delete(local_1b8._M_dataplus._M_p,__n);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != paVar5) {
      __n = local_198.field_2._M_allocated_capacity + 1;
      operator_delete(local_198._M_dataplus._M_p,__n);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      __n = local_a8.field_2._M_allocated_capacity + 1;
      operator_delete(local_a8._M_dataplus._M_p,__n);
    }
    pCVar7 = local_c8.
             super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __src = local_c8.
            super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
            ._M_impl.super__Vector_impl_data._M_start;
    local_88._4_4_ = VStack_f4;
    local_88._0_4_ = local_f8;
    local_88._16_8_ = CONCAT44(uStack_e4,local_e8);
    uStack_70 = CONCAT44(VStack_dc,uStack_e0);
    uStack_60 = CONCAT44(uStack_cc,uStack_d0);
    local_88._8_8_ = uStack_f0;
    local_68 = local_d8;
    __n_00 = (long)local_c8.
                   super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_c8.
                   super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    __dest = std::
             _Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
             ::_M_allocate((_Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                            *)(((long)__n_00 >> 4) * -0x3333333333333333),__n);
    lVar3 = (long)__dest + __n_00;
    local_58 = __dest;
    local_48 = lVar3;
    if (pCVar7 != __src) {
      memmove(__dest,__src,__n_00);
    }
    local_40 = local_b0;
    local_50 = lVar3;
    addTestGroup<vkt::api::(anonymous_namespace)::TestParams>
              (local_108,(string *)local_178,&local_1e8,
               addImageToImageAllFormatsDepthStencilFormatsTests,(TestParams *)&local_88.buffer);
    if (__dest != (pointer)0x0) {
      operator_delete(__dest,__n_00);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != paVar4) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_178._0_8_ != local_178 + 0x10) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ + 1);
    }
    if (__src != (pointer)0x0) {
      operator_delete(__src,(long)local_c8.
                                  super__Vector_base<vkt::api::(anonymous_namespace)::CopyRegion,_std::allocator<vkt::api::(anonymous_namespace)::CopyRegion>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src);
    }
    local_100 = local_100 + 1;
    if (local_100 == 7) {
      return;
    }
  } while( true );
}

Assistant:

void addImageToImageAllFormatsDepthStencilTests (tcu::TestCaseGroup* group)
{
	const VkFormat	depthAndStencilFormats[]	=
	{
		VK_FORMAT_D16_UNORM,
		VK_FORMAT_X8_D24_UNORM_PACK32,
		VK_FORMAT_D32_SFLOAT,
		VK_FORMAT_S8_UINT,
		VK_FORMAT_D16_UNORM_S8_UINT,
		VK_FORMAT_D24_UNORM_S8_UINT,
		VK_FORMAT_D32_SFLOAT_S8_UINT,
	};

	for (int compatibleFormatsIndex = 0; compatibleFormatsIndex < DE_LENGTH_OF_ARRAY(depthAndStencilFormats); ++compatibleFormatsIndex)
	{
		TestParams	params;
		params.src.image.imageType			= VK_IMAGE_TYPE_2D;
		params.dst.image.imageType			= VK_IMAGE_TYPE_2D;
		params.src.image.extent				= defaultExtent;
		params.dst.image.extent				= defaultExtent;
		params.src.image.format				= depthAndStencilFormats[compatibleFormatsIndex];
		params.dst.image.format				= params.src.image.format;

		const VkImageSubresourceLayers		defaultDepthSourceLayer		= { VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 0u, 1u };
		const VkImageSubresourceLayers		defaultStencilSourceLayer	= { VK_IMAGE_ASPECT_STENCIL_BIT, 0u, 0u, 1u };

		for (deInt32 i = 0; i < defaultSize; i += defaultFourthSize)
		{
			CopyRegion			copyRegion;
			const VkOffset3D	srcOffset	= {0, 0, 0};
			const VkOffset3D	dstOffset	= {i, defaultSize - i - defaultFourthSize, 0};
			const VkExtent3D	extent		= {defaultFourthSize, defaultFourthSize, 1};

			if (tcu::hasDepthComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultDepthSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
			if (tcu::hasStencilComponent(mapVkFormat(params.src.image.format).order))
			{
				const VkImageCopy				testCopy	=
				{
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	srcSubresource;
					srcOffset,					// VkOffset3D				srcOffset;
					defaultStencilSourceLayer,	// VkImageSubresourceLayers	dstSubresource;
					dstOffset,					// VkOffset3D				dstOffset;
					extent,						// VkExtent3D				extent;
				};

				copyRegion.imageCopy	= testCopy;
				params.regions.push_back(copyRegion);
			}
		}

		const std::string testName		= getFormatCaseName(params.src.image.format) + "_" + getFormatCaseName(params.dst.image.format);
		const std::string description	= "Copy from " + getFormatCaseName(params.src.image.format) + " to " + getFormatCaseName(params.dst.image.format);
		addTestGroup(group, testName, description, addImageToImageAllFormatsDepthStencilFormatsTests, params);
	}
}